

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteCDATA(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  int local_28;
  int sum;
  int count;
  xmlChar *content_local;
  xmlTextWriterPtr writer_local;
  
  local_28 = xmlTextWriterStartCDATA(writer);
  if (local_28 == -1) {
    writer_local._4_4_ = -1;
  }
  else {
    if (content != (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteString(writer,content);
      if (iVar1 == -1) {
        return -1;
      }
      local_28 = iVar1 + local_28;
    }
    iVar1 = xmlTextWriterEndCDATA(writer);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = iVar1 + local_28;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteCDATA(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartCDATA(writer);
    if (count == -1)
        return -1;
    sum += count;
    if (content != 0) {
        count = xmlTextWriterWriteString(writer, content);
        if (count == -1)
            return -1;
        sum += count;
    }
    count = xmlTextWriterEndCDATA(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}